

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::postfix_expression::~postfix_expression(postfix_expression *this)

{
  ~postfix_expression(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit postfix_expression(const source_extend& extend, token_type op, expression_ptr&& e) : expression(extend), op_(op), e_(std::move(e)) {
        assert(e_);
    }